

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O1

void __thiscall xmrig::OclBackend::setJob(OclBackend *this,Job *job)

{
  OclLaunchData *pOVar1;
  OclBackendPrivate *pOVar2;
  bool bVar3;
  int iVar4;
  Config *this_00;
  OclConfig *this_01;
  Miner *miner;
  char *fmt;
  OclLaunchData *other;
  OclLaunchData *this_02;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> local_68;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> local_48;
  
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  this_01 = Config::cl(this_00);
  if (this_01->m_enabled == true) {
    OclBackendPrivate::init(this->d_ptr,(EVP_PKEY_CTX *)this_01);
  }
  iVar4 = (*(this->super_IBackend)._vptr_IBackend[2])(this);
  if ((char)iVar4 == '\0') {
    (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
    return;
  }
  miner = Controller::miner(this->d_ptr->controller);
  OclConfig::get(&local_68,this_01,miner,&this->d_ptr->platform,&this->d_ptr->devices);
  other = local_68.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
          _M_impl.super__Vector_impl_data._M_start;
  this_02 = (this->d_ptr->threads).
            super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar1 = (this->d_ptr->threads).
           super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((this_02 != pOVar1) &&
      ((long)pOVar1 - (long)this_02 ==
       (long)local_68.
             super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)local_68.
             super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl
             .super__Vector_impl_data._M_start)) &&
     (bVar3 = OclLaunchData::isEqual
                        (this_02,local_68.
                                 super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>
                                 ._M_impl.super__Vector_impl_data._M_start), bVar3)) {
    do {
      this_02 = this_02 + 1;
      other = other + 1;
      if (this_02 == pOVar1) goto LAB_00162025;
      bVar3 = OclLaunchData::isEqual(this_02,other);
    } while (bVar3);
  }
  if (local_68.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_68.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    fmt = "%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (no suitable configuration found)\x1b[0m";
  }
  else {
    iVar4 = OclContext::init(&this->d_ptr->context,(EVP_PKEY_CTX *)&this->d_ptr->devices);
    if ((char)iVar4 != '\0') {
      (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
      pOVar2 = this->d_ptr;
      local_48.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pOVar2->threads).
           super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_48.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pOVar2->threads).
           super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_48.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pOVar2->threads).
           super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (pOVar2->threads).
      super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_68.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (pOVar2->threads).
      super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (pOVar2->threads).
      super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_68.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::~vector(&local_48);
      OclBackendPrivate::start(this->d_ptr,job);
      goto LAB_00162025;
    }
    fmt = "%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (OpenCL context unavailable)\x1b[0m";
  }
  Log::print(WARNING,fmt,"\x1b[45;1m\x1b[1;37m ocl \x1b[0m");
  (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
LAB_00162025:
  std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::~vector(&local_68);
  return;
}

Assistant:

void xmrig::OclBackend::setJob(const Job &job)
{
    const auto &cl = d_ptr->controller->config()->cl();
    if (cl.isEnabled()) {
        d_ptr->init(cl);
    }

    if (!isEnabled()) {
        return stop();
    }

    auto threads = cl.get(d_ptr->controller->miner(), d_ptr->platform, d_ptr->devices);
    if (!d_ptr->threads.empty() && d_ptr->threads.size() == threads.size() && std::equal(d_ptr->threads.begin(), d_ptr->threads.end(), threads.begin())) {
        return;
    }

    if (threads.empty()) {
        LOG_WARN("%s " RED_BOLD("disabled") YELLOW(" (no suitable configuration found)"), tag);

        return stop();
    }

    if (!d_ptr->context.init(d_ptr->devices, threads)) {
        LOG_WARN("%s " RED_BOLD("disabled") YELLOW(" (OpenCL context unavailable)"), tag);

        return stop();
    }

    stop();

    d_ptr->threads = std::move(threads);
    d_ptr->start(job);
}